

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cc
# Opt level: O2

BIGNUM * get_params(BIGNUM *ret,BN_ULONG *words,size_t num_words)

{
  int iVar1;
  BIGNUM *a;
  
  if (ret == (BIGNUM *)0x0) {
    ret = (BIGNUM *)BN_new();
    a = (BIGNUM *)ret;
    if ((BIGNUM *)ret == (BIGNUM *)0x0) {
      return (BIGNUM *)0x0;
    }
  }
  else {
    a = (BIGNUM *)0x0;
  }
  iVar1 = bn_set_words(ret,words,num_words);
  if (iVar1 == 0) {
    BN_free(a);
    return (BIGNUM *)0x0;
  }
  return (BIGNUM *)(BIGNUM *)ret;
}

Assistant:

static BIGNUM *get_params(BIGNUM *ret, const BN_ULONG *words,
                          size_t num_words) {
  BIGNUM *alloc = NULL;
  if (ret == NULL) {
    alloc = BN_new();
    if (alloc == NULL) {
      return NULL;
    }
    ret = alloc;
  }

  if (!bn_set_words(ret, words, num_words)) {
    BN_free(alloc);
    return NULL;
  }

  return ret;
}